

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_220;
  uv_pipe_t server2;
  uv_pipe_t server1;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server1,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&server1,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_pipe_init(puVar2,&server2,0);
      if (iVar1 == 0) {
        iVar1 = uv_pipe_bind(&server2,"/tmp/uv-test-sock");
        if (iVar1 == -0x62) {
          iVar1 = uv_listen((uv_stream_t *)&server1,0x1000,(uv_connection_cb)0x0);
          if (iVar1 == 0) {
            iVar1 = uv_listen((uv_stream_t *)&server2,0x1000,(uv_connection_cb)0x0);
            if (iVar1 == -0x16) {
              uv_close((uv_handle_t *)&server1,close_cb);
              uv_close((uv_handle_t *)&server2,close_cb);
              puVar2 = uv_default_loop();
              uv_run(puVar2,UV_RUN_DEFAULT);
              if (close_cb_called == 2) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uStack_220 = 0x46;
              }
              else {
                pcVar3 = "close_cb_called == 2";
                uStack_220 = 0x44;
              }
            }
            else {
              pcVar3 = "r == UV_EINVAL";
              uStack_220 = 0x3d;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_220 = 0x3b;
          }
        }
        else {
          pcVar3 = "r == UV_EADDRINUSE";
          uStack_220 = 0x38;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_220 = 0x36;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_220 = 0x33;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_220 = 0x31;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-bind-error.c"
          ,uStack_220,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT(r == UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}